

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

string * __thiscall
smf::Options::getString(string *__return_storage_ptr__,Options *this,string *optionName)

{
  bool bVar1;
  Option_register *pOVar2;
  long lVar3;
  uint uVar4;
  
  uVar4 = getRegIndex(this,optionName);
  if ((int)uVar4 < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"UNKNOWN OPTION","");
  }
  else {
    pOVar2 = (this->m_optionRegister).
             super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar4];
    bVar1 = pOVar2->m_modifiedQ;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar3 = *(long *)&(&pOVar2->m_defaultOption)[bVar1]._M_dataplus;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar3,
               (&pOVar2->m_defaultOption)[bVar1]._M_string_length + lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Options::getString(const std::string& optionName) {
	int index = getRegIndex(optionName);
	if (index < 0) {
		return "UNKNOWN OPTION";
	} else {
		return m_optionRegister[index]->getOption();
	}
}